

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

bsc_step_t
bsc_reduce_2tree_multiple
          (bsc_step_t depends,bsp_pid_t root,bsc_group_t group,bsc_coll_params_t *params,
          bsc_size_t n)

{
  bsc_step_t local_3c;
  int local_38;
  bsc_step_t finished;
  bsc_size_t i;
  bsc_size_t n_local;
  bsc_coll_params_t *params_local;
  bsc_group_t group_local;
  bsp_pid_t root_local;
  bsc_step_t depends_local;
  
  local_3c = depends;
  for (local_38 = 0; local_38 < n; local_38 = local_38 + 1) {
    local_3c = bsc_reduce_qtree_single
                         (depends,root,group,params[local_38].src,params[local_38].dst,
                          params[local_38].tmp,params[local_38].reducer,params[local_38].zero,
                          params[local_38].nmemb,params[local_38].size,2);
  }
  return local_3c;
}

Assistant:

bsc_step_t bsc_reduce_2tree_multiple( bsc_step_t depends,
                      bsp_pid_t root, bsc_group_t group, 
                      bsc_coll_params_t * params, bsc_size_t n)
{
    bsc_size_t i;
    bsc_step_t finished = depends;
    for ( i = 0; i < n ; ++i ) {
        finished = bsc_reduce_qtree_single( depends, root, group,
                   params[i].src, params[i].dst, params[i].tmp,
                   params[i].reducer, params[i].zero, 
                   params[i].nmemb, params[i].size, 2 );
    }

    return finished;
}